

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

bid_t docio_append_doc(docio_handle *handle,docio_object *doc,uint8_t deleted,uint8_t txn_enabled)

{
  bid_t bVar1;
  char in_CL;
  char in_DL;
  long in_RSI;
  docio_object *in_stack_00000068;
  docio_handle *in_stack_00000070;
  
  *(undefined1 *)(in_RSI + 0xc) = 0;
  if (in_DL != '\0') {
    *(byte *)(in_RSI + 0xc) = *(byte *)(in_RSI + 0xc) | 4;
  }
  if (in_CL != '\0') {
    *(byte *)(in_RSI + 0xc) = *(byte *)(in_RSI + 0xc) | 8;
  }
  bVar1 = _docio_append_doc(in_stack_00000070,in_stack_00000068);
  return bVar1;
}

Assistant:

bid_t docio_append_doc(struct docio_handle *handle, struct docio_object *doc,
                       uint8_t deleted, uint8_t txn_enabled)
{
    doc->length.flag = DOCIO_NORMAL;
    if (deleted) {
        doc->length.flag |= DOCIO_DELETED;
    }
    if (txn_enabled) {
        doc->length.flag |= DOCIO_TXN_DIRTY;
    }
    return _docio_append_doc(handle, doc);
}